

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_hsub_s_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  float32 fVar4;
  float32 fVar5;
  float32 fVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  fVar4 = pfVar1->fs[1];
  fVar5 = pfVar1->fs[2];
  fVar6 = pfVar1->fs[3];
  pfVar2 = (env->active_fpu).fpr + wt;
  sVar7 = *(short *)((long)pfVar2 + 4);
  sVar8 = *(short *)((long)pfVar2 + 8);
  sVar9 = *(short *)((long)pfVar2 + 0xc);
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fs[0] = ((int)pfVar1->fs[0] >> 0x10) - (int)*(short *)pfVar2;
  pfVar3->fs[1] = ((int)fVar4 >> 0x10) - (int)sVar7;
  pfVar3->fs[2] = ((int)fVar5 >> 0x10) - (int)sVar8;
  pfVar3->fs[3] = ((int)fVar6 >> 0x10) - (int)sVar9;
  return;
}

Assistant:

void helper_msa_hsub_s_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_hsub_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_hsub_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_hsub_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_hsub_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}